

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O0

uint32_t __thiscall BIP324Cipher::DecryptLength(BIP324Cipher *this,Span<const_std::byte> input)

{
  long lVar1;
  Span<std::byte> output;
  size_t sVar2;
  FSChaCha20 *this_00;
  FSChaCha20 *in_RDI;
  long in_FS_OFFSET;
  byte *in_stack_00000010;
  Span<const_std::byte> in_stack_00000020;
  byte buf [3];
  Span<const_std::byte> *in_stack_ffffffffffffff98;
  uint3 local_b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<const_std::byte>::size(in_stack_ffffffffffffff98);
  if (sVar2 != 3) {
    __assert_fail("input.size() == LENGTH_LEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x5b,"uint32_t BIP324Cipher::DecryptLength(Span<const std::byte>)");
  }
  this_00 = std::optional<FSChaCha20>::operator->((optional<FSChaCha20> *)in_stack_ffffffffffffff98)
  ;
  Span<std::byte>::Span<3>((Span<std::byte> *)this_00,(byte (*) [3])0x8b67de);
  output.m_size = (size_t)this;
  output.m_data = in_stack_00000010;
  FSChaCha20::Crypt(in_RDI,in_stack_00000020,output);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)local_b;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t BIP324Cipher::DecryptLength(Span<const std::byte> input) noexcept
{
    assert(input.size() == LENGTH_LEN);

    std::byte buf[LENGTH_LEN];
    // Decrypt length
    m_recv_l_cipher->Crypt(input, buf);
    // Convert to number.
    return uint32_t(buf[0]) + (uint32_t(buf[1]) << 8) + (uint32_t(buf[2]) << 16);
}